

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ParserFree(void *p,_func_void_void_ptr *freeProc)

{
  yyParser *pParser;
  _func_void_void_ptr *freeProc_local;
  void *p_local;
  
  if (p != (void *)0x0) {
    while (-1 < *p) {
      yy_pop_parser_stack((yyParser *)p);
    }
    (*freeProc)(p);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ParserFree(
  void *p,                    /* The parser to be deleted */
  void (*freeProc)(void*)     /* Function used to reclaim memory */
){
  yyParser *pParser = (yyParser*)p;
  /* In SQLite, we never try to destroy a parser that was not successfully
  ** created in the first place. */
  if( NEVER(pParser==0) ) return;
  while( pParser->yyidx>=0 ) yy_pop_parser_stack(pParser);
#if YYSTACKDEPTH<=0
  free(pParser->yystack);
#endif
  (*freeProc)((void*)pParser);
}